

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_convert_float.c
# Opt level: O0

int mpt_data_convert_float64(double *from,mpt_type_t type,void *dest)

{
  iovec *vec;
  double val;
  void *dest_local;
  mpt_type_t type_local;
  double *from_local;
  
  vec = (iovec *)0x0;
  if (from != (double *)0x0) {
    vec = (iovec *)*from;
  }
  switch(type) {
  case 0x44:
    if (dest != (void *)0x0) {
      *(double **)dest = from;
      *(undefined8 *)((long)dest + 8) = 8;
    }
    from_local._4_4_ = 0x10;
    break;
  default:
    from_local._4_4_ = -3;
    break;
  case 100:
    if (dest != (void *)0x0) {
      *(iovec **)dest = vec;
    }
    from_local._4_4_ = 8;
    break;
  case 0x65:
    if (dest != (void *)0x0) {
      *(longdouble *)dest = (longdouble)(double)vec;
    }
    from_local._4_4_ = 0x10;
    break;
  case 0x66:
    if (dest != (void *)0x0) {
      *(float *)dest = (float)(double)vec;
    }
    from_local._4_4_ = 4;
  }
  return from_local._4_4_;
}

Assistant:

extern int mpt_data_convert_float64(const double *from, MPT_TYPE(type) type, void *dest)
{
	double val = 0.0;
	if (from) {
		val = *from;
	}
	switch (type) {
		case 'f':
			if (dest) *((float *) dest) = val;
			return sizeof(float);
		case 'd':
			if (dest) *((double *) dest) = val;
			return sizeof(double);
#ifdef _MPT_FLOAT_EXTENDED_H
		case 'e':
			if (dest) *((long double *) dest) = val;
			return sizeof(long double);
#endif
		case MPT_type_toVector('d'):
			if (dest) {
				struct iovec *vec = dest;
				vec->iov_base = (void *) from;
				vec->iov_len  = sizeof(*from);
			}
			return sizeof(struct iovec);
		default: return MPT_ERROR(BadType); /* invalid conversion */
	}
}